

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Minefield_Query_PDU::AddSensorType(Minefield_Query_PDU *this,SensorType ST)

{
  KUINT16 *pKVar1;
  byte bVar2;
  undefined2 uVar3;
  iterator __position;
  unsigned_short local_a;
  
  local_a = (unsigned_short)ST;
  __position._M_current =
       (this->m_vui16SensorTypes).
       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_realloc_insert<unsigned_short>
              (&this->m_vui16SensorTypes,__position,&local_a);
  }
  else {
    *__position._M_current = local_a;
    (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  uVar3 = (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = uVar3 + 2;
  bVar2 = this->m_ui8NumSensTyp;
  this->m_ui8NumSensTyp = bVar2 + 1;
  if (this->m_bNeedsPadding == true) {
    (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = uVar3;
  }
  if ((bVar2 & 1) == 0) {
    this->m_bNeedsPadding = true;
    pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 2;
  }
  else {
    this->m_bNeedsPadding = false;
  }
  return;
}

Assistant:

void Minefield_Query_PDU::AddSensorType( SensorType ST )
{
    m_vui16SensorTypes.push_back( ST );
    m_ui16PDULength += 2; // 16 bit enum. = 2 octets
    ++m_ui8NumSensTyp;
    calcPadding();
}